

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

int QMetaTypeIdQObject<QBluetoothPermission,_512>::qt_metatype_id(void)

{
  Type TVar1;
  char *data;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((__atomic_base<int>)qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i ==
      (__atomic_base<int>)0x0) {
    data = QMetaObject::className(&QBluetoothPermission::staticMetaObject);
    QByteArray::QByteArray((QByteArray *)&QStack_28,data,-1);
    TVar1.super___atomic_base<int>._M_i =
         (__atomic_base<int>)
         qRegisterNormalizedMetaTypeImplementation<QBluetoothPermission>((QByteArray *)&QStack_28);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_28);
    qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i =
         (Type)(Type)TVar1.super___atomic_base<int>._M_i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (int)qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i;
  }
  __stack_chk_fail();
}

Assistant:

static int qt_metatype_id()
    {
        Q_CONSTINIT static QBasicAtomicInt metatype_id = Q_BASIC_ATOMIC_INITIALIZER(0);
        if (const int id = metatype_id.loadAcquire())
            return id;
        const char *const cName = T::staticMetaObject.className();
        const int newId = qRegisterNormalizedMetaType<T>(cName);
        metatype_id.storeRelease(newId);
        return newId;
    }